

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O3

TSpirvTypeParameters * __thiscall
glslang::TParseContext::makeSpirvTypeParameters
          (TParseContext *this,TSourceLoc *loc,TIntermConstantUnion *constant)

{
  pointer *ppTVar1;
  iterator __position;
  int iVar2;
  TPoolAllocator *pTVar3;
  vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  *this_00;
  undefined4 extraout_var;
  char *pcVar4;
  _Variadic_union<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*> local_30;
  undefined1 uStack_28;
  uint7 uStack_27;
  
  pTVar3 = GetThreadPoolAllocator();
  this_00 = (vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             *)TPoolAllocator::allocate(pTVar3,0x20);
  (this_00->
  super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  )._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  (this_00->
  super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->
  super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->
  super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar3 = GetThreadPoolAllocator();
  (this_00->
  super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  )._M_impl.super__Tp_alloc_type.allocator = pTVar3;
  (this_00->
  super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->
  super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->
  super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(constant);
  if ((((iVar2 != 1) &&
       (iVar2 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])
                          (constant), iVar2 != 8)) &&
      (iVar2 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(constant)
      , iVar2 != 9)) &&
     ((iVar2 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(constant)
      , iVar2 != 0xc &&
      (iVar2 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(constant)
      , iVar2 != 0x1b)))) {
    iVar2 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(constant);
    pcVar4 = TType::getBasicString((uint)*(byte *)(CONCAT44(extraout_var,iVar2) + 8));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"this type not allowed",pcVar4,"");
    return (TSpirvTypeParameters *)this_00;
  }
  uStack_28 = 0;
  __position._M_current =
       (this_00->
       super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->
      super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_30 = (_Variadic_union<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>)
               constant;
    std::
    vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>::
    _M_realloc_insert<glslang::TSpirvTypeParameter>
              (this_00,__position,(TSpirvTypeParameter *)&local_30._M_first);
  }
  else {
    *(TIntermConstantUnion **)
     &((__position._M_current)->value).
      super__Variant_base<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>.
      super__Move_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>.
      super__Copy_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>.
      super__Move_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>.
      super__Copy_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>.
      super__Variant_storage_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*> =
         constant;
    *(ulong *)&((__position._M_current)->value).
               super__Variant_base<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>.
               super__Move_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
               .
               super__Copy_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
               .
               super__Move_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
               .
               super__Copy_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
               .
               super__Variant_storage_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
               ._M_index = (ulong)uStack_27 << 8;
    ppTVar1 = &(this_00->
               super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  return (TSpirvTypeParameters *)this_00;
}

Assistant:

TSpirvTypeParameters* TParseContext::makeSpirvTypeParameters(const TSourceLoc& loc, const TIntermConstantUnion* constant)
{
    TSpirvTypeParameters* spirvTypeParams = new TSpirvTypeParameters;
    if (constant->getBasicType() != EbtFloat &&
        constant->getBasicType() != EbtInt &&
        constant->getBasicType() != EbtUint &&
        constant->getBasicType() != EbtBool &&
        constant->getBasicType() != EbtString)
        error(loc, "this type not allowed", constant->getType().getBasicString(), "");
    else
        spirvTypeParams->push_back(TSpirvTypeParameter(constant));

    return spirvTypeParams;
}